

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

PackedColor Imath_2_5::rgb2packed<unsigned_char>(Color4<unsigned_char> *c)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte *in_RDI;
  float x;
  float y;
  float a;
  float b;
  float g;
  float r;
  Color4<float> local_30;
  float local_20;
  float local_1c;
  PackedColor local_4;
  
  bVar2 = limits<unsigned_char>::isIntegral();
  if (bVar2) {
    bVar1 = *in_RDI;
    bVar3 = limits<unsigned_char>::max();
    x = (float)bVar1 / (float)bVar3;
    bVar1 = in_RDI[1];
    bVar3 = limits<unsigned_char>::max();
    y = (float)bVar1 / (float)bVar3;
    bVar1 = in_RDI[2];
    bVar3 = limits<unsigned_char>::max();
    local_1c = (float)bVar1 / (float)bVar3;
    bVar1 = in_RDI[3];
    bVar3 = limits<unsigned_char>::max();
    local_20 = (float)bVar1 / (float)bVar3;
    Color4<float>::Color4(&local_30,x,y,local_1c,local_20);
    local_4 = rgb2packed<float>((Color4<float> *)CONCAT44(x,y));
  }
  else {
    local_4 = (uint)*in_RDI * 0xff | (uint)in_RDI[1] * 0xff00 | (uint)in_RDI[2] * 0xff0000 |
              (uint)in_RDI[3] * -0x1000000;
  }
  return local_4;
}

Assistant:

PackedColor
rgb2packed(const Color4<T> &c)
{
    if ( limits<T>::isIntegral() )
    {
	float r = c.r / float(limits<T>::max());
	float g = c.g / float(limits<T>::max());
	float b = c.b / float(limits<T>::max());
	float a = c.a / float(limits<T>::max());
	return rgb2packed( C4f(r,g,b,a) );
    }
    else
    {
	return (  (PackedColor) (c.r * 255)		|
		(((PackedColor) (c.g * 255)) << 8)	|
		(((PackedColor) (c.b * 255)) << 16)	|
		(((PackedColor) (c.a * 255)) << 24));
    }
}